

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

void xml2_error_hdr(void *arg,char *msg,xmlParserSeverities severity,xmlTextReaderLocatorPtr locator
                   )

{
  archive_read *a;
  xmlTextReaderLocatorPtr locator_local;
  xmlParserSeverities severity_local;
  char *msg_local;
  void *arg_local;
  
  switch(severity) {
  case XML_PARSER_SEVERITY_VALIDITY_WARNING:
  case XML_PARSER_SEVERITY_WARNING:
    archive_set_error((archive *)arg,-1,"XML Parsing error: %s",msg);
    break;
  case XML_PARSER_SEVERITY_VALIDITY_ERROR:
  case XML_PARSER_SEVERITY_ERROR:
    archive_set_error((archive *)arg,-1,"XML Parsing error: %s",msg);
  }
  return;
}

Assistant:

static void
xml2_error_hdr(void *arg, const char *msg, xmlParserSeverities severity,
    xmlTextReaderLocatorPtr locator)
{
	struct archive_read *a;

	(void)locator; /* UNUSED */
	a = (struct archive_read *)arg;
	switch (severity) {
	case XML_PARSER_SEVERITY_VALIDITY_WARNING:
	case XML_PARSER_SEVERITY_WARNING:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "XML Parsing error: %s", msg);
		break;
	case XML_PARSER_SEVERITY_VALIDITY_ERROR:
	case XML_PARSER_SEVERITY_ERROR:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "XML Parsing error: %s", msg);
		break;
	}
}